

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall
ExprTest_NumericConstant_Test::ExprTest_NumericConstant_Test(ExprTest_NumericConstant_Test *this)

{
  undefined8 *in_RDI;
  ExprTest *in_stack_00000040;
  
  ExprTest::ExprTest(in_stack_00000040);
  *in_RDI = &PTR__ExprTest_NumericConstant_Test_00227730;
  return;
}

Assistant:

TEST_F(ExprTest, NumericConstant) {
  mp::NumericConstant e;
  EXPECT_TRUE(e == 0);
  (void)NumericExpr(e);
  e = factory_.MakeNumericConstant(1.23);
  EXPECT_EQ(expr::NUMBER, e.kind());
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(1.23, e.value());
}